

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool Catch::Internal::
     Evaluator<bsim::quad_value_bit_vector,_bsim::quad_value_bit_vector,_(Catch::Internal::Operator)2>
     ::evaluate(quad_value_bit_vector *lhs,quad_value_bit_vector *rhs)

{
  quad_value_bit_vector *pqVar1;
  ulong uVar2;
  byte *pbVar3;
  uchar uVar4;
  uint uVar5;
  uint uVar6;
  quad_value_bit_vector *a;
  pointer pqVar7;
  long lVar8;
  bool bVar9;
  quad_value_bit_vector *pqVar10;
  quad_value_bit_vector *b;
  ulong uVar11;
  
  a = (quad_value_bit_vector *)
      (lhs->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
      super__Vector_impl_data._M_start;
  uVar5 = lhs->N;
  b = (quad_value_bit_vector *)(ulong)uVar5;
  pqVar7 = (rhs->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = rhs->N;
  if (0 < (int)uVar5) {
    if (1 < *(byte *)&(a->bits).
                      super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
                      _M_impl.super__Vector_impl_data._M_start) {
      return false;
    }
    pqVar10 = (quad_value_bit_vector *)0x0;
    do {
      if ((quad_value_bit_vector *)&b[-1].field_0x1f == pqVar10) goto LAB_00141354;
      pqVar1 = (quad_value_bit_vector *)
               ((long)&(pqVar10->bits).
                       super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
                       _M_impl.super__Vector_impl_data._M_start + 1);
      pbVar3 = (undefined1 *)
               ((long)&(a->bits).
                       super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
                       _M_impl.super__Vector_impl_data._M_start + 1) + (long)pqVar10;
      pqVar10 = pqVar1;
    } while (*pbVar3 < 2);
    if (pqVar1 < b) {
      return false;
    }
  }
LAB_00141354:
  if ((int)uVar6 < 1) {
    if (uVar6 != uVar5) {
LAB_001413b4:
      bVar9 = bsim::operator>(a,b);
      return !bVar9;
    }
  }
  else if (pqVar7->value < 2) {
    uVar11 = 0;
    do {
      if ((ulong)uVar6 - 1 == uVar11) goto LAB_0014137d;
      uVar2 = uVar11 + 1;
      lVar8 = uVar11 + 1;
      uVar11 = uVar2;
    } while (pqVar7[lVar8].value < 2);
    if (uVar6 <= uVar2) {
LAB_0014137d:
      if (uVar6 != uVar5) goto LAB_001413b4;
      pqVar10 = (quad_value_bit_vector *)0x0;
      do {
        uVar4 = *(uchar *)((long)&(pqVar10->bits).
                                  super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>
                                  ._M_impl.super__Vector_impl_data._M_start +
                          (long)&(a->bits).
                                 super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
        if (uVar4 == '\x03') {
          __assert_fail("!a.is_high_impedance()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                        ,0x109,"bool bsim::operator!=(const quad_value &, const quad_value &)");
        }
        if (pqVar7[(long)pqVar10].value == '\x03') {
          __assert_fail("!b.is_high_impedance()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                        ,0x10a,"bool bsim::operator!=(const quad_value &, const quad_value &)");
        }
        if ((uVar4 == '\x02') || (uVar4 != pqVar7[(long)pqVar10].value)) goto LAB_001413b4;
        pqVar10 = (quad_value_bit_vector *)
                  ((long)&(pqVar10->bits).
                          super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
                          _M_impl.super__Vector_impl_data._M_start + 1);
      } while (b != pqVar10);
    }
  }
  return false;
}

Assistant:

static bool evaluate( T1 const& lhs, T2 const& rhs ) {
            return opCast( lhs ) < opCast( rhs );
        }